

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::clauseWithin(SelectionCompiler *this)

{
  undefined1 uVar1;
  any *in_RDI;
  Token tokenDistance;
  any distance;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  undefined2 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff27;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  SelectionCompiler *in_stack_ffffffffffffff48;
  undefined4 local_a8;
  SelectionCompiler *in_stack_ffffffffffffff60;
  undefined4 local_90;
  undefined4 local_68;
  undefined4 local_40;
  undefined1 local_1;
  
  tokenNext((SelectionCompiler *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  Token::~Token((Token *)0x3fc566);
  tokenNext((SelectionCompiler *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  Token::~Token((Token *)0x3fc590);
  if (local_40 == 0x400) {
    std::any::any((any *)0x3fc5c0);
    tokenNext((SelectionCompiler *)CONCAT44(local_40,in_stack_ffffffffffffff38));
    if (local_68 - 2U < 2) {
      std::any::operator=(in_RDI,(any *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
                                                ));
      tokenNext((SelectionCompiler *)CONCAT44(local_40,in_stack_ffffffffffffff38));
      Token::~Token((Token *)0x3fc671);
      if (local_90 == 0x404) {
        uVar1 = clauseOr(in_stack_ffffffffffffff48);
        if ((bool)uVar1) {
          tokenNext((SelectionCompiler *)CONCAT44(local_40,in_stack_ffffffffffffff38));
          Token::~Token((Token *)0x3fc6f8);
          if (local_a8 == 0x401) {
            Token::Token((Token *)CONCAT17(in_stack_ffffffffffffff27,
                                           CONCAT16(uVar1,CONCAT24(in_stack_ffffffffffffff24,0x401))
                                          ),
                         CONCAT13(in_stack_ffffffffffffff1f,
                                  CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)),
                         (any *)0x3fc741);
            local_1 = addTokenToPostfix((SelectionCompiler *)
                                        CONCAT17(in_stack_ffffffffffffff27,
                                                 CONCAT16(uVar1,CONCAT24(in_stack_ffffffffffffff24,
                                                                         local_a8))),
                                        (Token *)CONCAT17(in_stack_ffffffffffffff1f,
                                                          CONCAT16(in_stack_ffffffffffffff1e,
                                                                   CONCAT24(
                                                  in_stack_ffffffffffffff1c,
                                                  in_stack_ffffffffffffff18))));
            Token::~Token((Token *)0x3fc76f);
          }
          else {
            local_1 = rightParenthesisExpected(in_stack_ffffffffffffff60);
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = commaExpected(in_stack_ffffffffffffff60);
      }
    }
    else {
      local_1 = numberOrKeywordExpected(in_stack_ffffffffffffff60);
    }
    Token::~Token((Token *)0x3fc7a0);
    std::any::~any((any *)0x3fc7ad);
  }
  else {
    local_1 = leftParenthesisExpected(in_stack_ffffffffffffff60);
  }
  return local_1;
}

Assistant:

bool SelectionCompiler::clauseWithin() {
    tokenNext();                                // WITHIN
    if (tokenNext().tok != Token::leftparen) {  // (
      return leftParenthesisExpected();
    }

    std::any distance;
    Token tokenDistance = tokenNext();  // distance
    switch (tokenDistance.tok) {
    case Token::integer:
    case Token::decimal:
      distance = tokenDistance.value;
      break;
    default:
      return numberOrKeywordExpected();
    }

    if (tokenNext().tok != Token::opOr) {  // ,
      return commaExpected();
    }

    if (!clauseOr()) {  // *expression*
      return false;
    }

    if (tokenNext().tok != Token::rightparen) {  // )T
      return rightParenthesisExpected();
    }

    return addTokenToPostfix(Token(Token::within, distance));
  }